

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  short *psVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  undefined8 *puVar8;
  uv_interface_address_t *puVar9;
  char *pcVar10;
  undefined4 uVar11;
  in_addr_t iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ifaddrs *addrs;
  undefined8 *local_30;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar5 = getifaddrs(&local_30);
  puVar8 = local_30;
  if (iVar5 == 0) {
    for (; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
      if ((((~*(uint *)(puVar8 + 2) & 0x41) == 0) && ((short *)puVar8[3] != (short *)0x0)) &&
         (*(short *)puVar8[3] != 0x11)) {
        *count = *count + 1;
      }
    }
    if ((long)*count != 0) {
      puVar9 = (uv_interface_address_t *)uv__malloc((long)*count * 0x50);
      *addresses = puVar9;
      puVar4 = local_30;
      puVar8 = local_30;
      if (puVar9 == (uv_interface_address_t *)0x0) {
        freeifaddrs(local_30);
        return -0xc;
      }
      for (; local_30 = puVar8, puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
        if ((((~*(uint *)(puVar4 + 2) & 0x41) == 0) && ((short *)puVar4[3] != (short *)0x0)) &&
           (*(short *)puVar4[3] != 0x11)) {
          pcVar10 = uv__strdup((char *)puVar4[1]);
          puVar9->name = pcVar10;
          psVar1 = (short *)puVar4[3];
          if (*psVar1 == 10) {
            uVar11 = *(undefined4 *)psVar1;
            iVar12 = *(in_addr_t *)(psVar1 + 2);
            uVar13 = *(undefined4 *)(psVar1 + 4);
            uVar14 = *(undefined4 *)(psVar1 + 6);
            uVar3 = *(undefined8 *)(psVar1 + 10);
            *(undefined8 *)((long)&puVar9->address + 0xc) = *(undefined8 *)(psVar1 + 6);
            *(undefined8 *)((long)&puVar9->address + 0x14) = uVar3;
          }
          else {
            uVar11 = *(undefined4 *)psVar1;
            iVar12 = *(in_addr_t *)(psVar1 + 2);
            uVar13 = *(undefined4 *)(psVar1 + 4);
            uVar14 = *(undefined4 *)(psVar1 + 6);
          }
          *(undefined4 *)&puVar9->address = uVar11;
          (puVar9->address).address4.sin_addr.s_addr = iVar12;
          *(undefined4 *)((long)&puVar9->address + 8) = uVar13;
          *(undefined4 *)((long)&puVar9->address + 0xc) = uVar14;
          psVar1 = (short *)puVar4[4];
          if (*psVar1 == 10) {
            uVar11 = *(undefined4 *)psVar1;
            iVar12 = *(in_addr_t *)(psVar1 + 2);
            uVar13 = *(undefined4 *)(psVar1 + 4);
            uVar14 = *(undefined4 *)(psVar1 + 6);
            uVar3 = *(undefined8 *)(psVar1 + 10);
            *(undefined8 *)((long)&puVar9->netmask + 0xc) = *(undefined8 *)(psVar1 + 6);
            *(undefined8 *)((long)&puVar9->netmask + 0x14) = uVar3;
          }
          else {
            uVar11 = *(undefined4 *)psVar1;
            iVar12 = *(in_addr_t *)(psVar1 + 2);
            uVar13 = *(undefined4 *)(psVar1 + 4);
            uVar14 = *(undefined4 *)(psVar1 + 6);
          }
          *(undefined4 *)&puVar9->netmask = uVar11;
          (puVar9->netmask).netmask4.sin_addr.s_addr = iVar12;
          *(undefined4 *)((long)&puVar9->netmask + 8) = uVar13;
          *(undefined4 *)((long)&puVar9->netmask + 0xc) = uVar14;
          puVar9->is_internal = *(uint *)(puVar4 + 2) >> 3 & 1;
          puVar9 = puVar9 + 1;
        }
        puVar8 = local_30;
      }
      for (; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
        if ((((~*(uint *)(puVar8 + 2) & 0x41) == 0) && ((short *)puVar8[3] != (short *)0x0)) &&
           ((*(short *)puVar8[3] == 0x11 && (0 < *count)))) {
          pcVar10 = (*addresses)->phys_addr;
          iVar5 = 0;
          do {
            iVar6 = strcmp(((uv_interface_address_t *)(pcVar10 + -8))->name,(char *)puVar8[1]);
            if (iVar6 == 0) {
              lVar2 = puVar8[3];
              *(undefined2 *)(pcVar10 + 4) = *(undefined2 *)(lVar2 + 0x10);
              *(undefined4 *)pcVar10 = *(undefined4 *)(lVar2 + 0xc);
            }
            else {
              pcVar10[4] = '\0';
              pcVar10[5] = '\0';
              pcVar10[0] = '\0';
              pcVar10[1] = '\0';
              pcVar10[2] = '\0';
              pcVar10[3] = '\0';
            }
            iVar5 = iVar5 + 1;
            pcVar10 = pcVar10 + 0x50;
          } while (iVar5 < *count);
        }
      }
    }
    freeifaddrs(local_30);
    iVar5 = 0;
  }
  else {
    piVar7 = __errno_location();
    iVar5 = -*piVar7;
  }
  return iVar5;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
#ifndef HAVE_IFADDRS_H
  *count = 0;
  *addresses = NULL;
  return UV_ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  *addresses = uv__malloc(*count * sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      if (strcmp(address->name, ent->ifa_name) == 0) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      } else {
        memset(address->phys_addr, 0, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}